

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrace.cpp
# Opt level: O2

int32_t utrace_vformat_63(char *outBuf,int32_t capacity,int32_t indent,char *fmt,__va_list_tag *args
                         )

{
  uint uVar1;
  long *plVar2;
  int *piVar3;
  undefined8 *puVar4;
  int32_t *piVar5;
  ulong uVar6;
  ulong uVar7;
  int32_t charsToOutput;
  char cVar8;
  long *plVar9;
  UChar *s;
  long *val;
  int32_t iVar10;
  long lVar11;
  char *pcVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int32_t outIx;
  int32_t local_84;
  long *local_80;
  __va_list_tag *local_78;
  long *local_70;
  long local_68;
  ulong local_60;
  int local_54;
  long *local_50;
  long *local_48;
  long *local_40;
  char *local_38;
  
  outIx = 0;
  local_80 = (long *)0x0;
  iVar14 = 0;
  local_84 = indent;
  local_78 = args;
LAB_002c9629:
  iVar13 = iVar14 + 3;
  pcVar12 = fmt + iVar14;
  lVar11 = (long)iVar14 << 0x20;
  while( true ) {
    iVar10 = local_84;
    lVar11 = lVar11 + 0x100000000;
    cVar8 = *pcVar12;
    if (cVar8 == '%') break;
    outputChar(cVar8,outBuf,&outIx,capacity,local_84);
    iVar13 = iVar13 + 1;
    pcVar12 = pcVar12 + 1;
    if (cVar8 == '\0') {
      outputChar('\0',outBuf,&outIx,capacity,local_84);
      return outIx + 1;
    }
  }
  iVar14 = iVar13 + -1;
  cVar8 = fmt[lVar11 >> 0x20];
  switch(cVar8) {
  case 'b':
    uVar1 = local_78->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar3 = (int *)((ulong)uVar1 + (long)local_78->reg_save_area);
      local_78->gp_offset = uVar1 + 8;
    }
    else {
      piVar3 = (int *)local_78->overflow_arg_area;
      local_78->overflow_arg_area = piVar3 + 2;
    }
    plVar9 = (long *)(long)*piVar3;
    iVar10 = 2;
    break;
  case 'c':
    uVar1 = local_78->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      pcVar12 = (char *)((ulong)uVar1 + (long)local_78->reg_save_area);
      local_78->gp_offset = uVar1 + 8;
    }
    else {
      pcVar12 = (char *)local_78->overflow_arg_area;
      local_78->overflow_arg_area = pcVar12 + 8;
    }
    cVar8 = *pcVar12;
LAB_002c9cf5:
    outputChar(cVar8,outBuf,&outIx,capacity,iVar10);
    goto LAB_002c9629;
  case 'd':
    uVar1 = local_78->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar3 = (int *)((ulong)uVar1 + (long)local_78->reg_save_area);
      local_78->gp_offset = uVar1 + 8;
    }
    else {
      piVar3 = (int *)local_78->overflow_arg_area;
      local_78->overflow_arg_area = piVar3 + 2;
    }
    plVar9 = (long *)(long)*piVar3;
    iVar10 = 8;
    break;
  case 'e':
  case 'f':
  case 'g':
  case 'i':
  case 'j':
  case 'k':
  case 'm':
  case 'n':
  case 'o':
switchD_002c96aa_caseD_65:
    outputChar(cVar8,outBuf,&outIx,capacity,local_84);
    goto LAB_002c9629;
  case 'h':
    uVar1 = local_78->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      piVar3 = (int *)((ulong)uVar1 + (long)local_78->reg_save_area);
      local_78->gp_offset = uVar1 + 8;
    }
    else {
      piVar3 = (int *)local_78->overflow_arg_area;
      local_78->overflow_arg_area = piVar3 + 2;
    }
    plVar9 = (long *)(long)*piVar3;
    iVar10 = 4;
    break;
  case 'l':
    uVar1 = local_78->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)local_78->reg_save_area);
      local_78->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)local_78->overflow_arg_area;
      local_78->overflow_arg_area = puVar4 + 1;
    }
    plVar9 = (long *)*puVar4;
    iVar10 = 0x10;
    local_80 = plVar9;
    break;
  case 'p':
    uVar1 = local_78->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar4 = (undefined8 *)((ulong)uVar1 + (long)local_78->reg_save_area);
      local_78->gp_offset = uVar1 + 8;
    }
    else {
      puVar4 = (undefined8 *)local_78->overflow_arg_area;
      local_78->overflow_arg_area = puVar4 + 1;
    }
    outputPtrBytes((void *)*puVar4,outBuf,&outIx,capacity);
    goto LAB_002c9629;
  default:
    if (cVar8 == '\0') {
      iVar14 = iVar13 + -2;
      outputChar('%',outBuf,&outIx,capacity,local_84);
    }
    else if (cVar8 == 'S') {
      uVar1 = local_78->gp_offset;
      uVar7 = (ulong)uVar1;
      if (uVar7 < 0x29) {
        local_78->gp_offset = (uint)(uVar7 + 8);
        s = *(UChar **)((long)local_78->reg_save_area + uVar7);
        if (0x20 < uVar1) goto LAB_002c99b1;
        piVar5 = (int32_t *)(uVar7 + 8 + (long)local_78->reg_save_area);
        local_78->gp_offset = uVar1 + 0x10;
      }
      else {
        puVar4 = (undefined8 *)local_78->overflow_arg_area;
        local_78->overflow_arg_area = puVar4 + 1;
        s = (UChar *)*puVar4;
LAB_002c99b1:
        piVar5 = (int32_t *)local_78->overflow_arg_area;
        local_78->overflow_arg_area = piVar5 + 2;
      }
      outputUString(s,*piVar5,outBuf,&outIx,capacity,local_84);
    }
    else {
      if (cVar8 != 's') {
        if (cVar8 != 'v') goto switchD_002c96aa_caseD_65;
        uVar7 = (ulong)(byte)fmt[iVar14];
        if (fmt[iVar14] == 0) {
          iVar13 = iVar14;
        }
        uVar1 = local_78->gp_offset;
        uVar6 = (ulong)uVar1;
        if (uVar6 < 0x29) {
          local_78->gp_offset = (uint)(uVar6 + 8);
          plVar9 = *(long **)((long)local_78->reg_save_area + uVar6);
          if (0x20 < uVar1) goto LAB_002c99f4;
          piVar3 = (int *)(uVar6 + 8 + (long)local_78->reg_save_area);
          local_78->gp_offset = uVar1 + 0x10;
        }
        else {
          puVar4 = (undefined8 *)local_78->overflow_arg_area;
          local_78->overflow_arg_area = puVar4 + 1;
          plVar9 = (long *)*puVar4;
LAB_002c99f4:
          piVar3 = (int *)local_78->overflow_arg_area;
          local_78->overflow_arg_area = piVar3 + 2;
        }
        lVar11 = (long)*piVar3;
        local_68 = lVar11;
        if (plVar9 == (long *)0x0) {
          outputString("*NULL* ",outBuf,&outIx,capacity,local_84);
          iVar14 = iVar13;
          val = local_80;
        }
        else {
          charsToOutput = 0;
          iVar15 = 0;
          val = local_80;
          local_70 = plVar9;
          local_60 = uVar7;
          local_54 = iVar13;
          local_50 = plVar9;
          local_48 = plVar9;
          local_40 = plVar9;
          local_38 = fmt;
          do {
            plVar2 = local_70;
            iVar14 = local_54;
            iVar10 = local_84;
            if ((int)lVar11 != -1 && (int)lVar11 <= iVar15) goto LAB_002c9cb5;
            iVar14 = (int)uVar7;
            switch(iVar14) {
            case 0x62:
              val = (long *)(long)(char)*plVar9;
              plVar9 = (long *)((long)plVar9 + 1);
              charsToOutput = 2;
              break;
            case 99:
              outputChar((char)*plVar9,outBuf,&outIx,capacity,local_84);
              val = (long *)(long)(char)*plVar9;
              plVar9 = (long *)((long)plVar9 + 1);
              goto LAB_002c9c63;
            case 100:
              val = (long *)(long)(int)*local_48;
              local_48 = (long *)((long)local_48 + 4);
              charsToOutput = 8;
              break;
            case 0x65:
            case 0x66:
            case 0x67:
            case 0x69:
            case 0x6a:
            case 0x6b:
            case 0x6d:
            case 0x6e:
            case 0x6f:
switchD_002c9a65_caseD_65:
              if (charsToOutput != 0) break;
              goto LAB_002c9c65;
            case 0x68:
              val = (long *)(long)(short)*local_40;
              local_40 = (long *)((long)local_40 + 2);
              charsToOutput = 4;
              break;
            case 0x6c:
              val = (long *)*local_50;
              local_50 = local_50 + 1;
              charsToOutput = 0x10;
              break;
            case 0x70:
              outputPtrBytes((void *)*local_70,outBuf,&outIx,capacity);
              val = (long *)(ulong)(*plVar2 != 0);
              local_70 = plVar2 + 1;
              goto LAB_002c9c63;
            default:
              if (iVar14 == 0x53) {
                local_80 = plVar9;
                outputUString((UChar *)*local_70,-1,outBuf,&outIx,capacity,local_84);
                outputChar('\n',outBuf,&outIx,capacity,local_84);
                val = (long *)(ulong)(*plVar2 != 0);
                local_70 = plVar2 + 1;
                plVar9 = local_80;
              }
              else {
                if (iVar14 != 0x73) goto switchD_002c9a65_caseD_65;
                local_80 = plVar9;
                outputString((char *)*local_70,outBuf,&outIx,capacity,local_84);
                outputChar('\n',outBuf,&outIx,capacity,local_84);
                val = (long *)(ulong)(*plVar2 != 0);
                local_70 = plVar2 + 1;
                plVar9 = local_80;
              }
LAB_002c9c63:
              charsToOutput = 0;
              uVar7 = local_60;
              lVar11 = local_68;
              goto LAB_002c9c65;
            }
            local_80 = plVar9;
            outputHexBytes((int64_t)val,charsToOutput,outBuf,&outIx,capacity);
            outputChar(' ',outBuf,&outIx,capacity,local_84);
            plVar9 = local_80;
            uVar7 = local_60;
            lVar11 = local_68;
            fmt = local_38;
LAB_002c9c65:
            iVar15 = iVar15 + 1;
          } while (((int)lVar11 != -1) || (val != (long *)0x0));
          local_80 = (long *)0x0;
          iVar14 = local_54;
          iVar10 = local_84;
          val = local_80;
        }
LAB_002c9cb5:
        local_80 = val;
        outputChar('[',outBuf,&outIx,capacity,iVar10);
        outputHexBytes(local_68,8,outBuf,&outIx,capacity);
        cVar8 = ']';
        goto LAB_002c9cf5;
      }
      uVar1 = local_78->gp_offset;
      if ((ulong)uVar1 < 0x29) {
        puVar4 = (undefined8 *)((ulong)uVar1 + (long)local_78->reg_save_area);
        local_78->gp_offset = uVar1 + 8;
      }
      else {
        puVar4 = (undefined8 *)local_78->overflow_arg_area;
        local_78->overflow_arg_area = puVar4 + 1;
      }
      outputString((char *)*puVar4,outBuf,&outIx,capacity,local_84);
    }
    goto LAB_002c9629;
  }
  outputHexBytes((int64_t)plVar9,iVar10,outBuf,&outIx,capacity);
  goto LAB_002c9629;
}

Assistant:

U_CAPI int32_t U_EXPORT2
utrace_vformat(char *outBuf, int32_t capacity, int32_t indent, const char *fmt, va_list args) {
    int32_t   outIx  = 0;
    int32_t   fmtIx  = 0;
    char      fmtC;
    char      c;
    int32_t   intArg;
    int64_t   longArg = 0;
    char      *ptrArg;

    /*   Loop runs once for each character in the format string.
     */
    for (;;) {
        fmtC = fmt[fmtIx++];
        if (fmtC != '%') {
            /* Literal character, not part of a %sequence.  Just copy it to the output. */
            outputChar(fmtC, outBuf, &outIx, capacity, indent);
            if (fmtC == 0) {
                /* We hit the null that terminates the format string.
                 * This is the normal (and only) exit from the loop that
                 * interprets the format
                 */
                break;
            }
            continue;
        }

        /* We encountered a '%'.  Pick up the following format char */
        fmtC = fmt[fmtIx++];

        switch (fmtC) {
        case 'c':
            /* single 8 bit char   */
            c = (char)va_arg(args, int32_t);
            outputChar(c, outBuf, &outIx, capacity, indent);
            break;

        case 's':
            /* char * string, null terminated.  */
            ptrArg = va_arg(args, char *);
            outputString((const char *)ptrArg, outBuf, &outIx, capacity, indent);
            break;

        case 'S':
            /* UChar * string, with length, len==-1 for null terminated. */
            ptrArg = va_arg(args, char *);             /* Ptr    */
            intArg =(int32_t)va_arg(args, int32_t);    /* Length */
            outputUString((const UChar *)ptrArg, intArg, outBuf, &outIx, capacity, indent);
            break;

        case 'b':
            /*  8 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 2, outBuf, &outIx, capacity);
            break;

        case 'h':
            /*  16 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 4, outBuf, &outIx, capacity);
            break;

        case 'd':
            /*  32 bit int  */
            intArg = va_arg(args, int);
            outputHexBytes(intArg, 8, outBuf, &outIx, capacity);
            break;

        case 'l':
            /*  64 bit long  */
            longArg = va_arg(args, int64_t);
            outputHexBytes(longArg, 16, outBuf, &outIx, capacity);
            break;
            
        case 'p':
            /*  Pointers.   */
            ptrArg = va_arg(args, char *);
            outputPtrBytes(ptrArg, outBuf, &outIx, capacity);
            break;

        case 0:
            /* Single '%' at end of fmt string.  Output as literal '%'.   
             * Back up index into format string so that the terminating null will be
             * re-fetched in the outer loop, causing it to terminate.
             */
            outputChar('%', outBuf, &outIx, capacity, indent);
            fmtIx--;
            break;

        case 'v':
            {
                /* Vector of values, e.g. %vh */
                char     vectorType;
                int32_t  vectorLen;
                const char   *i8Ptr;
                int16_t  *i16Ptr;
                int32_t  *i32Ptr;
                int64_t  *i64Ptr;
                void     **ptrPtr;
                int32_t   charsToOutput = 0;
                int32_t   i;
                
                vectorType = fmt[fmtIx];    /* b, h, d, l, p, etc. */
                if (vectorType != 0) {
                    fmtIx++;
                }
                i8Ptr = (const char *)va_arg(args, void*);
                i16Ptr = (int16_t *)i8Ptr;
                i32Ptr = (int32_t *)i8Ptr;
                i64Ptr = (int64_t *)i8Ptr;
                ptrPtr = (void **)i8Ptr;
                vectorLen =(int32_t)va_arg(args, int32_t);
                if (ptrPtr == NULL) {
                    outputString("*NULL* ", outBuf, &outIx, capacity, indent);
                } else {
                    for (i=0; i<vectorLen || vectorLen==-1; i++) { 
                        switch (vectorType) {
                        case 'b':
                            charsToOutput = 2;
                            longArg = *i8Ptr++;
                            break;
                        case 'h':
                            charsToOutput = 4;
                            longArg = *i16Ptr++;
                            break;
                        case 'd':
                            charsToOutput = 8;
                            longArg = *i32Ptr++;
                            break;
                        case 'l':
                            charsToOutput = 16;
                            longArg = *i64Ptr++;
                            break;
                        case 'p':
                            charsToOutput = 0;
                            outputPtrBytes(*ptrPtr, outBuf, &outIx, capacity);
                            longArg = *ptrPtr==NULL? 0: 1;    /* test for null terminated array. */
                            ptrPtr++;
                            break;
                        case 'c':
                            charsToOutput = 0;
                            outputChar(*i8Ptr, outBuf, &outIx, capacity, indent);
                            longArg = *i8Ptr;    /* for test for null terminated array. */
                            i8Ptr++;
                            break;
                        case 's':
                            charsToOutput = 0;
                            outputString((const char *)*ptrPtr, outBuf, &outIx, capacity, indent);
                            outputChar('\n', outBuf, &outIx, capacity, indent);
                            longArg = *ptrPtr==NULL? 0: 1;   /* for test for null term. array. */
                            ptrPtr++;
                            break;

                        case 'S':
                            charsToOutput = 0;
                            outputUString((const UChar *)*ptrPtr, -1, outBuf, &outIx, capacity, indent);
                            outputChar('\n', outBuf, &outIx, capacity, indent);
                            longArg = *ptrPtr==NULL? 0: 1;   /* for test for null term. array. */
                            ptrPtr++;
                            break;

                            
                        }
                        if (charsToOutput > 0) {
                            outputHexBytes(longArg, charsToOutput, outBuf, &outIx, capacity);
                            outputChar(' ', outBuf, &outIx, capacity, indent);
                        }
                        if (vectorLen == -1 && longArg == 0) {
                            break;
                        }
                    }
                }
                outputChar('[', outBuf, &outIx, capacity, indent);
                outputHexBytes(vectorLen, 8, outBuf, &outIx, capacity);
                outputChar(']', outBuf, &outIx, capacity, indent);
            }
            break;


        default:
            /* %. in format string, where . is some character not in the set
             *    of recognized format chars.  Just output it as if % wasn't there.
             *    (Covers "%%" outputing a single '%')
             */
             outputChar(fmtC, outBuf, &outIx, capacity, indent);
        }
    }
    outputChar(0, outBuf, &outIx, capacity, indent);  /* Make sure that output is null terminated  */
    return outIx + 1;     /* outIx + 1 because outIx does not increment when outputing final null. */
}